

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O2

Factor * __thiscall libDAI::TRW::beliefF(Factor *__return_storage_ptr__,TRW *this,size_t I)

{
  int iVar1;
  undefined4 extraout_var;
  VarSet *pVVar2;
  undefined4 extraout_var_00;
  size_t sVar3;
  undefined4 extraout_var_01;
  size_t j;
  undefined4 extraout_var_02;
  TFactor<double> *this_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar4;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  Prob *pPVar5;
  undefined4 extraout_var_09;
  Exception *pEVar6;
  long lVar7;
  size_t *psVar8;
  double dVar9;
  size_t *local_160;
  string local_150;
  VarSet v_J;
  Var v_j;
  Var v_i_1;
  Var v_i;
  VarSet v_I;
  Var v_k;
  Factor prod;
  
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  pVVar2 = (VarSet *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x50))
                     ((long *)CONCAT44(extraout_var,iVar1),I);
  VarSet::VarSet(&v_I,pVVar2);
  TFactor<double>::TFactor(&prod);
  lVar7 = (long)v_I._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)v_I._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_start >> 4;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pEVar6 = (Exception *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&v_J,"trw.cpp, line 575",(allocator<char> *)&local_150);
      Exception::Exception(pEVar6,0,(string *)&v_J);
      __cxa_throw(pEVar6,&Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    v_i._label = (v_I._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                  super__Vector_impl_data._M_start)->_label;
    v_i._states = (v_I._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_start)->_states;
    VarSet::VarSet((VarSet *)&local_150,&v_i);
    VarSet::operator/(&v_J,&v_I,(VarSet *)&local_150);
    v_j._label = (v_J._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                  super__Vector_impl_data._M_start)->_label;
    v_j._states = (v_J._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                   super__Vector_impl_data._M_start)->_states;
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&v_J);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_150);
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    sVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x40))
                      ((long *)CONCAT44(extraout_var_00,iVar1),&v_i);
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    j = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x40))
                  ((long *)CONCAT44(extraout_var_01,iVar1),&v_j);
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    this_00 = (TFactor<double> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x50))
                        ((long *)CONCAT44(extraout_var_02,iVar1),I);
    dVar9 = rho(this,sVar3,j);
    TFactor<double>::operator^((TFactor<double> *)&v_J,this_00,1.0 / dVar9);
    TFactor<double>::operator=(&prod,(TFactor<double> *)&v_J);
    TFactor<double>::~TFactor((TFactor<double> *)&v_J);
  }
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  local_160 = *(size_t **)(*(long *)(CONCAT44(extraout_var_03,iVar1) + 0x88) + I * 0x18);
  do {
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    if (local_160 == *(size_t **)(*(long *)(CONCAT44(extraout_var_04,iVar1) + 0x88) + 8 + I * 0x18))
    {
      TFactor<double>::normalized(__return_storage_ptr__,&prod,NORMPROB);
      TFactor<double>::~TFactor(&prod);
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&v_I);
      return __return_storage_ptr__;
    }
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar1) + 0x30))
                               ((long *)CONCAT44(extraout_var_05,iVar1),*local_160);
    v_i_1._label = *plVar4;
    v_i_1._states = plVar4[1];
    TProb<double>::TProb((TProb<double> *)&v_j,v_i_1._states);
    iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    psVar8 = *(size_t **)(*(long *)(CONCAT44(extraout_var_06,iVar1) + 0x70) + *local_160 * 0x18);
    while( true ) {
      iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      if (psVar8 == *(size_t **)
                     (*(long *)(CONCAT44(extraout_var_07,iVar1) + 0x70) + 8 + *local_160 * 0x18))
      break;
      iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      pVVar2 = (VarSet *)
               (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar1) + 0x50))
                         ((long *)CONCAT44(extraout_var_08,iVar1),*psVar8);
      VarSet::VarSet(&v_J,pVVar2);
      lVar7 = (long)v_J._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)v_J._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                    super__Vector_impl_data._M_start >> 4;
      if (lVar7 == 2) {
        VarSet::VarSet((VarSet *)&v_i,&v_i_1);
        VarSet::operator/((VarSet *)&local_150,&v_J,(VarSet *)&v_i);
        v_k._label = *(long *)local_150._M_dataplus._M_p;
        v_k._states = *(size_t *)(local_150._M_dataplus._M_p + 8);
        std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                  ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_150);
        std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                  ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&v_i);
        iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this)
        ;
        sVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar1) + 0x40))
                          ((long *)CONCAT44(extraout_var_09,iVar1),&v_k);
        if (*psVar8 == I) {
          pPVar5 = newMessage(this,*local_160,I);
          dVar9 = rho(this,*local_160,sVar3);
          TProb<double>::operator^((TProb<double> *)&local_150,pPVar5,dVar9 + -1.0);
        }
        else {
          pPVar5 = newMessage(this,*local_160,*psVar8);
          dVar9 = rho(this,*local_160,sVar3);
          TProb<double>::operator^((TProb<double> *)&local_150,pPVar5,dVar9);
        }
        TProb<double>::operator*=((TProb<double> *)&v_j,(TProb<double> *)&local_150);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&local_150);
      }
      else {
        if (lVar7 != 1) {
          pEVar6 = (Exception *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_150,"trw.cpp, line 593",(allocator<char> *)&v_i);
          Exception::Exception(pEVar6,0,&local_150);
          __cxa_throw(pEVar6,&Exception::typeinfo,std::runtime_error::~runtime_error);
        }
        pPVar5 = newMessage(this,*local_160,*psVar8);
        TProb<double>::operator*=((TProb<double> *)&v_j,pPVar5);
      }
      std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
                ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&v_J);
      psVar8 = psVar8 + 1;
    }
    VarSet::VarSet((VarSet *)&local_150,&v_i_1);
    TFactor<double>::TFactor((TFactor<double> *)&v_J,(VarSet *)&local_150,(TProb<double> *)&v_j);
    TFactor<double>::operator*=(&prod,(TFactor<double> *)&v_J);
    TFactor<double>::~TFactor((TFactor<double> *)&v_J);
    std::_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>::~_Vector_base
              ((_Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_> *)&local_150);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&v_j);
    local_160 = local_160 + 1;
  } while( true );
}

Assistant:

Factor TRW::beliefF (size_t I) const {
        VarSet v_I = grm().factor(I).vars();
        
        Factor prod;
        if( v_I.size() == 1 )
            ;
        else if( v_I.size() == 2 ) {
            Var v_i = *(v_I.begin());
            Var v_j = *((v_I / v_i).begin());
            size_t i = grm().findVar(v_i);
            size_t j = grm().findVar(v_j);
            prod = grm().factor(I)^(1.0 / rho(i,j));
        } else
            DAI_THROW(NOT_IMPLEMENTED);

        for( FactorGraph::nb_cit i = grm().nbF(I).begin(); i != grm().nbF(I).end(); i++ ) {
            Var v_i = grm().var( *i );
            Prob prod_i( v_i.states() );

            for( FactorGraph::nb_cit J = grm().nbV(*i).begin(); J != grm().nbV(*i).end(); J++ ) {
                VarSet v_J = grm().factor(*J).vars();
                if( v_J.size() == 1 ) {
                    prod_i *= newMessage(*i,*J);
                } else if( v_J.size() == 2 ) {
                    Var v_k = *((v_J / v_i).begin());
                    size_t k = grm().findVar(v_k);
                    if( *J != I )
                        prod_i *= newMessage(*i,*J)^rho(*i,k);
                    else
                        prod_i *= newMessage(*i,*J)^(rho(*i,k) - 1.0);
                } else
                    DAI_THROW(NOT_IMPLEMENTED);
            }

            prod *= Factor( v_i, prod_i );
        }

        return prod.normalized();
    }